

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(defV *data,complex<double> *val)

{
  double *pdVar1;
  pointer pcVar2;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  ulong uVar8;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar10;
  undefined8 extraout_XMM0_Qa;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 in_XMM1_Qa;
  string_view val_00;
  
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar3 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    dVar11 = *pvVar3;
    break;
  case '\x01':
    pvVar6 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    dVar11 = (double)*pvVar6;
    break;
  default:
    pvVar5 = (variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    pcVar10 = extraout_RDX_00;
LAB_00289125:
    val_00._M_str = pcVar10;
    val_00._M_len = (size_t)(pvVar5->name)._M_dataplus._M_p;
    getComplexFromString((helics *)(pvVar5->name)._M_string_length,val_00);
    *(undefined8 *)val->_M_value = extraout_XMM0_Qa;
    *(undefined8 *)(val->_M_value + 8) = in_XMM1_Qa;
    return;
  case '\x03':
    pvVar4 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    uVar12 = *(undefined8 *)pvVar4->_M_value;
    uVar13 = *(undefined8 *)(pvVar4->_M_value + 8);
    goto LAB_00289181;
  case '\x04':
    pvVar7 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    pdVar1 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1;
    if (uVar8 != 8) {
      if (uVar8 < 9) {
        return;
      }
      dVar11 = pdVar1[1];
      *(double *)val->_M_value = *pdVar1;
      *(double *)(val->_M_value + 8) = dVar11;
      return;
    }
    dVar11 = *pdVar1;
    break;
  case '\x05':
    pvVar9 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    pcVar2 = (pvVar9->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (pcVar2 == (pvVar9->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    uVar12 = *(undefined8 *)pcVar2->_M_value;
    uVar13 = *(undefined8 *)(pcVar2->_M_value + 8);
LAB_00289181:
    *(undefined8 *)val->_M_value = uVar12;
    *(undefined8 *)(val->_M_value + 8) = uVar13;
    return;
  case '\x06':
    pvVar5 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    dVar11 = pvVar5->value;
    pcVar10 = extraout_RDX;
    if (NAN(dVar11)) goto LAB_00289125;
  }
  *(double *)val->_M_value = dVar11;
  *(undefined8 *)(val->_M_value + 8) = 0;
  return;
}

Assistant:

void valueExtract(const defV& data, std::complex<double>& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::complex<double>(std::get<double>(data), 0.0);
            break;
        case int_loc:  // int64_t
            val = std::complex<double>(static_cast<double>(std::get<int64_t>(data)), 0.0);
            break;
        case string_loc:  // string
        default:
            val = getComplexFromString(std::get<std::string>(data));
            break;
        case complex_loc:  // complex
            val = std::get<std::complex<double>>(data);
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            if (vec.size() == 1) {
                val = std::complex<double>(vec[0], 0.0);
            } else if (vec.size() >= 2) {
                val = std::complex<double>(vec[0], vec[1]);
            }
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            if (!vec.empty()) {
                val = vec.front();
            }
            break;
        }
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = getComplexFromString(point.name);
            } else {
                val = std::complex<double>(point.value, 0.0);
            }
        } break;
    }
}